

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O1

void __thiscall
xmrig::Network::onResultAccepted
          (Network *this,IStrategy *param_1,IClient *param_2,SubmitResult *result,char *error)

{
  char *pcVar1;
  char *fmt;
  char *pcVar2;
  
  NetworkState::add(&this->m_state,result,error);
  pcVar1 = backend_tag(result->backend);
  pcVar2 = (char *)result->elapsed;
  if (error == (char *)0x0) {
    fmt = 
    "%s \x1b[1;32maccepted\x1b[0m (%ld/%ld) diff \x1b[1;37m%lu\x1b[0m \x1b[1;30m(%lu ms)\x1b[0m";
  }
  else {
    fmt = 
    "%s \x1b[1;31mrejected\x1b[0m (%ld/%ld) diff \x1b[1;37m%lu\x1b[0m \x1b[0;31m\"%s\"\x1b[0m \x1b[1;30m(%lu ms)\x1b[0m"
    ;
    pcVar2 = error;
  }
  Log::print(INFO,fmt,pcVar1,(this->m_state).accepted,(this->m_state).rejected,result->diff,pcVar2);
  return;
}

Assistant:

void xmrig::Network::onResultAccepted(IStrategy *, IClient *, const SubmitResult &result, const char *error)
{
    m_state.add(result, error);

    if (error) {
        LOG_INFO("%s " RED_BOLD("rejected") " (%" PRId64 "/%" PRId64 ") diff " WHITE_BOLD("%" PRIu64) " " RED("\"%s\"") " " BLACK_BOLD("(%" PRIu64 " ms)"),
                 backend_tag(result.backend), m_state.accepted, m_state.rejected, result.diff, error, result.elapsed);
    }
    else {
        LOG_INFO("%s " GREEN_BOLD("accepted") " (%" PRId64 "/%" PRId64 ") diff " WHITE_BOLD("%" PRIu64) " " BLACK_BOLD("(%" PRIu64 " ms)"),
                 backend_tag(result.backend), m_state.accepted, m_state.rejected, result.diff, result.elapsed);
    }
}